

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O0

void write_function_element<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,problem *p,
               vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *f)

{
  bool bVar1;
  reference format_str;
  iterator iVar2;
  const_reference pvVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  function_element *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range1;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *f_local;
  problem *p_local;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx_local;
  
  __end0 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
           begin(f);
  elem = (function_element *)
         std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::end
                   (f);
  while (bVar1 = __gnu_cxx::
                 operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                           (&__end0,(__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                     *)&elem), ((bVar1 ^ 0xffU) & 1) != 0) {
    format_str = __gnu_cxx::
                 __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                 ::operator*(&__end0);
    if (format_str->factor < 0) {
      iVar2 = fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out(ctx);
      pvVar3 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&(p->vars).names,(long)format_str->variable_index);
      fmt::v7::
      format_to<fmt::v7::detail::buffer_appender<char>,char[7],int_const&,std::basic_string_view<char,std::char_traits<char>>const&,true>
                ((v7 *)iVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 (buffer_appender<char>)0xc8e612,(char (*) [7])format_str,(int *)pvVar3,in_R8);
    }
    else if (0 < format_str->factor) {
      iVar2 = fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out(ctx);
      pvVar3 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[](&(p->vars).names,(long)format_str->variable_index);
      fmt::v7::
      format_to<fmt::v7::detail::buffer_appender<char>,char[8],int_const&,std::basic_string_view<char,std::char_traits<char>>const&,true>
                ((v7 *)iVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 (buffer_appender<char>)0xc8e611,(char (*) [8])format_str,(int *)pvVar3,in_R8);
    }
    iVar2 = fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::out(ctx);
    fmt::v7::format_to<fmt::v7::detail::buffer_appender<char>,char[2],,true>
              ((buffer_appender<char>)
               iVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               (char (*) [2])0xc8b227);
    __gnu_cxx::
    __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void
write_function_element(FormatContext& ctx, const Problem& p, const Function& f)
{
    for (auto& elem : f) {
        if (elem.factor < 0)
            fmt::format_to(ctx.out(),
                           " {} {}",
                           elem.factor,
                           p.vars.names[elem.variable_index]);
        else if (elem.factor > 0)
            fmt::format_to(ctx.out(),
                           "+ {} {}",
                           elem.factor,
                           p.vars.names[elem.variable_index]);

        fmt::format_to(ctx.out(), " ");
    }
}